

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::VarintCasesWithSizes_WriteVarint32_Test::
~VarintCasesWithSizes_WriteVarint32_Test(VarintCasesWithSizes_WriteVarint32_Test *this)

{
  io::anon_unknown_0::VarintCasesWithSizes_WriteVarint32_Test::
  ~VarintCasesWithSizes_WriteVarint32_Test
            ((VarintCasesWithSizes_WriteVarint32_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint32) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  if (kVarintCases_case.value > uint64_t{0x00000000FFFFFFFFu}) {
    // Skip this test for the 64-bit values.
    return;
  }

  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint32(static_cast<uint32_t>(kVarintCases_case.value));
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}